

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string_view name)

{
  string_view name_00;
  bool bVar1;
  pointer this_00;
  Symbol local_48;
  Symbol symbol;
  basic_string_view<char,_std::char_traits<char>_> prefix;
  size_t pos;
  DescriptorPool *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (DescriptorPool *)name._M_len;
  for (prefix._M_str =
            (char *)std::basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,'.',0
                              ); prefix._M_str != (char *)0xffffffffffffffff;
      prefix._M_str =
           (char *)std::basic_string_view<char,_std::char_traits<char>_>::find
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,'.',
                              (size_type)(prefix._M_str + 1))) {
    _symbol = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0,
                         (size_type)prefix._M_str);
    this_00 = std::
              unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ::operator->(&this->tables_);
    local_48 = Tables::FindSymbol(this_00,_symbol);
    bVar1 = Symbol::IsNull(&local_48);
    if (bVar1) break;
    bVar1 = Symbol::IsPackage(&local_48);
    if (!bVar1) {
      return true;
    }
  }
  if (this->underlay_ == (DescriptorPool *)0x0) {
    name_local._M_str._7_1_ = false;
  }
  else {
    name_00._M_str = (char *)name_local._M_len;
    name_00._M_len = (size_t)this_local;
    name_local._M_str._7_1_ = IsSubSymbolOfBuiltType(this->underlay_,name_00);
  }
  return name_local._M_str._7_1_;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(absl::string_view name) const {
  for (size_t pos = name.find('.'); pos != name.npos;
       pos = name.find('.', pos + 1)) {
    auto prefix = name.substr(0, pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    if (symbol.IsNull()) {
      break;
    }
    if (!symbol.IsPackage()) {
      // If the symbol type is anything other than PACKAGE, then its complete
      // definition is already known.
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}